

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestPackedExtensions::~TestPackedExtensions(TestPackedExtensions *this)

{
  TestPackedExtensions *this_local;
  
  ~TestPackedExtensions(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestPackedExtensions::~TestPackedExtensions() {
  // @@protoc_insertion_point(destructor:edition_unittest.TestPackedExtensions)
  SharedDtor(*this);
}